

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O2

void DES_ncbc_encrypt_ex(uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *schedule,
                        uint8_t *ivec,int enc)

{
  byte *pbVar1;
  uint8_t uVar2;
  uint uVar3;
  uint8_t uVar4;
  uint uVar5;
  uint8_t uVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  long lVar11;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint8_t *local_48;
  DES_key_schedule *local_40;
  uint local_34;
  
  local_54 = *(uint *)ivec;
  local_50 = *(uint *)(ivec + 4);
  local_48 = ivec;
  local_40 = (DES_key_schedule *)schedule;
  if (enc == 0) {
    puVar8 = in + 7;
    uVar7 = local_50;
    local_4c = local_54;
    for (; 7 < len; len = len - 8) {
      uVar3 = *(uint *)(puVar8 + -7);
      uVar5 = *(uint *)(puVar8 + -3);
      local_54 = uVar3;
      local_50 = uVar5;
      DES_encrypt1(&local_54,local_40,0);
      local_4c = local_4c ^ local_54;
      uVar7 = uVar7 ^ local_50;
      *out = (uint8_t)local_4c;
      out[1] = (uint8_t)(local_4c >> 8);
      out[2] = (uint8_t)(local_4c >> 0x10);
      out[3] = (uint8_t)(local_4c >> 0x18);
      out[4] = (uint8_t)uVar7;
      out[5] = (uint8_t)(uVar7 >> 8);
      out[6] = (uint8_t)(uVar7 >> 0x10);
      out[7] = (uint8_t)(uVar7 >> 0x18);
      out = out + 8;
      puVar8 = puVar8 + 8;
      uVar7 = uVar5;
      local_4c = uVar3;
    }
    local_34 = local_4c;
    if (len == 0) goto LAB_003e4f81;
    local_54 = *(uint *)(puVar8 + -7);
    uVar3 = *(uint *)(puVar8 + -3);
    local_50 = uVar3;
    local_34 = local_54;
    DES_encrypt1(&local_54,local_40,0);
    local_4c = local_4c ^ local_54;
    uVar7 = uVar7 ^ local_50;
    puVar8 = out + len;
    switch(len) {
    case 1:
      goto LAB_003e4f7a;
    case 2:
      break;
    case 7:
      puVar8[-1] = (uint8_t)(uVar7 >> 0x10);
      puVar8 = puVar8 + -1;
    case 6:
      puVar8[-1] = (uint8_t)(uVar7 >> 8);
      puVar8 = puVar8 + -1;
    case 5:
      puVar8[-1] = (uint8_t)uVar7;
      puVar8 = puVar8 + -1;
    case 4:
      puVar8[-1] = (uint8_t)(local_4c >> 0x18);
      puVar8 = puVar8 + -1;
    case 3:
      puVar8[-1] = (uint8_t)(local_4c >> 0x10);
      puVar8 = puVar8 + -1;
    }
    puVar8[-1] = (uint8_t)(local_4c >> 8);
    puVar8 = puVar8 + -1;
LAB_003e4f7a:
    puVar8[-1] = (uint8_t)local_4c;
    uVar7 = uVar3;
LAB_003e4f81:
    *local_48 = (uint8_t)local_34;
    local_48[1] = (uint8_t)(local_34 >> 8);
    local_48[2] = (uint8_t)(local_34 >> 0x10);
    local_48[3] = (uint8_t)(local_34 >> 0x18);
    local_48[4] = (uint8_t)uVar7;
    local_48[5] = (uint8_t)(uVar7 >> 8);
    local_48[6] = (uint8_t)(uVar7 >> 0x10);
    local_48[7] = (uint8_t)(uVar7 >> 0x18);
    return;
  }
  puVar8 = out + 7;
  for (; 7 < len; len = len - 8) {
    local_54 = local_54 ^ *(uint *)in;
    local_50 = local_50 ^ *(uint *)((long)in + 4);
    DES_encrypt1(&local_54,local_40,1);
    *(uint *)(puVar8 + -7) = local_54;
    *(uint *)(puVar8 + -3) = local_50;
    puVar8 = puVar8 + 8;
    in = (uint8_t *)((long)in + 8);
  }
  if (len == 0) {
    uVar2 = (uint8_t)(local_54 >> 8);
    uVar4 = (uint8_t)(local_54 >> 0x10);
    uVar6 = (uint8_t)(local_54 >> 0x18);
    uVar9 = (uint8_t)(local_50 >> 8);
    uVar10 = (uint8_t)(local_50 >> 0x10);
    goto LAB_003e4f08;
  }
  lVar11 = (long)in + len;
  uVar7 = 0;
  uVar3 = 0;
  switch(len) {
  case 1:
    uVar5 = 0;
    goto LAB_003e4eb7;
  case 2:
    uVar5 = 0;
    goto LAB_003e4eaa;
  case 3:
    uVar5 = 0;
    uVar7 = uVar3;
    break;
  case 7:
    pbVar1 = (byte *)(lVar11 + -1);
    lVar11 = lVar11 + -1;
    uVar7 = (uint)*pbVar1 << 0x10;
  case 6:
    pbVar1 = (byte *)(lVar11 + -1);
    lVar11 = lVar11 + -1;
    uVar7 = uVar7 | (uint)*pbVar1 << 8;
  case 5:
    pbVar1 = (byte *)(lVar11 + -1);
    lVar11 = lVar11 + -1;
    uVar3 = uVar7 | *pbVar1;
  case 4:
    pbVar1 = (byte *)(lVar11 + -1);
    lVar11 = lVar11 + -1;
    uVar7 = (uint)*pbVar1 << 0x18;
    uVar5 = uVar3;
  }
  pbVar1 = (byte *)(lVar11 + -1);
  lVar11 = lVar11 + -1;
  uVar3 = uVar7 | (uint)*pbVar1 << 0x10;
LAB_003e4eaa:
  pbVar1 = (byte *)(lVar11 + -1);
  lVar11 = lVar11 + -1;
  uVar3 = uVar3 | (uint)*pbVar1 << 8;
LAB_003e4eb7:
  local_54 = (*(byte *)(lVar11 + -1) | uVar3) ^ local_54;
  local_50 = uVar5 ^ local_50;
  DES_encrypt1(&local_54,local_40,1);
  uVar2 = (uint8_t)(local_54 >> 8);
  uVar4 = (uint8_t)(local_54 >> 0x10);
  *(uint *)(puVar8 + -7) = local_54;
  uVar6 = (uint8_t)(local_54 >> 0x18);
  uVar9 = (uint8_t)(local_50 >> 8);
  uVar10 = (uint8_t)(local_50 >> 0x10);
  *(uint *)(puVar8 + -3) = local_50;
LAB_003e4f08:
  *local_48 = (uint8_t)local_54;
  local_48[1] = uVar2;
  local_48[2] = uVar4;
  local_48[3] = uVar6;
  local_48[4] = (uint8_t)local_50;
  local_48[5] = uVar9;
  local_48[6] = uVar10;
  local_48[7] = (uint8_t)(local_50 >> 0x18);
  return;
}

Assistant:

void DES_ncbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                         const DES_key_schedule *schedule, uint8_t ivec[8],
                         int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  unsigned char *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin[0] = tin0;
      tin1 ^= tout1;
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_ENCRYPT);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin[0] = tin0;
      tin1 ^= tout1;
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_ENCRYPT);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_DECRYPT);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = tin0;
      xor1 = tin1;
    }
    if (len != 0) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_DECRYPT);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = tin0;
      xor1 = tin1;
    }
    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }
  tin[0] = tin[1] = 0;
}